

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

handle pybind11::detail::type_caster_generic::cast
                 (void *_src,return_value_policy policy,handle parent,type_info *tinfo,
                 _func_void_ptr_void_ptr *copy_constructor,_func_void_ptr_void_ptr *move_constructor
                 ,void *existing_holder)

{
  pointer pptVar1;
  PyObject *pPVar2;
  bool bVar3;
  byte bVar4;
  internals *piVar5;
  _Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false> _Var6;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *pvVar7;
  handle hVar8;
  void *pvVar9;
  cast_error *this;
  _Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false> it_i;
  iterator *this_00;
  pointer pptVar10;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>_>
  pVar11;
  void *src;
  object inst;
  values_and_holders local_70;
  iterator local_60;
  
  if (tinfo == (type_info *)0x0) {
    return (handle)(PyObject *)0x0;
  }
  src = _src;
  if (_src == (void *)0x0) {
    __Py_NoneStruct = __Py_NoneStruct + 1;
    this_00 = &local_60;
    hVar8.m_ptr = (PyObject *)&_Py_NoneStruct;
    goto LAB_001295cb;
  }
  piVar5 = get_internals();
  pVar11 = std::
           _Hashtable<const_void_*,_std::pair<const_void_*const,_pybind11::detail::instance_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
           ::equal_range(&(piVar5->registered_instances)._M_h,&src);
  for (_Var6._M_cur = (__node_type *)
                      pVar11.first.
                      super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                      ._M_cur;
      (_Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>)
      _Var6._M_cur !=
      pVar11.second.
      super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>.
      _M_cur.
      super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>;
      _Var6._M_cur = (__node_type *)((_Var6._M_cur)->super__Hash_node_base)._M_nxt) {
    pvVar7 = all_type_info(*(PyTypeObject **)
                            (*(long *)((long)&((_Var6._M_cur)->
                                              super__Hash_node_value<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                                              ).
                                              super__Hash_node_value_base<std::pair<const_void_*const,_pybind11::detail::instance_*>_>
                                              ._M_storage._M_storage + 8) + 8));
    pptVar1 = (pvVar7->
              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (pptVar10 = (pvVar7->
                    super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                    )._M_impl.super__Vector_impl_data._M_start; pptVar10 != pptVar1;
        pptVar10 = pptVar10 + 1) {
      if ((*pptVar10 != (type_info *)0x0) &&
         (bVar3 = std::type_info::operator==((*pptVar10)->cpptype,tinfo->cpptype), bVar3)) {
        pPVar2 = *(PyObject **)
                  ((long)&((_Var6._M_cur)->
                          super__Hash_node_value<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                          ).
                          super__Hash_node_value_base<std::pair<const_void_*const,_pybind11::detail::instance_*>_>
                          ._M_storage._M_storage + 8);
        if (pPVar2 == (PyObject *)0x0) {
          return (handle)(PyObject *)0x0;
        }
        pPVar2->ob_refcnt = pPVar2->ob_refcnt + 1;
        return (handle)pPVar2;
      }
    }
  }
  hVar8.m_ptr = make_new_instance(tinfo->type);
  *(byte *)&hVar8.m_ptr[3].ob_refcnt = (byte)hVar8.m_ptr[3].ob_refcnt & 0xfe;
  inst.super_handle.m_ptr = (handle)(handle)hVar8.m_ptr;
  local_70.inst = (instance *)hVar8.m_ptr;
  local_70.tinfo = all_type_info((hVar8.m_ptr)->ob_type);
  values_and_holders::begin(&local_60,&local_70);
  switch(policy) {
  case automatic:
  case take_ownership:
    pvVar9 = src;
    break;
  case automatic_reference:
  case reference:
    *local_60.curr.vh = src;
    bVar4 = (byte)hVar8.m_ptr[3].ob_refcnt & 0xfe;
    goto LAB_001296a9;
  case copy:
    if (copy_constructor == (_func_void_ptr_void_ptr *)0x0) {
      this = (cast_error *)__cxa_allocate_exception(0x10);
      cast_error::runtime_error(this,"return_value_policy = copy, but the object is non-copyable!");
      goto LAB_00129719;
    }
    pvVar9 = (*copy_constructor)(src);
    break;
  case move:
    if ((move_constructor == (_func_void_ptr_void_ptr *)0x0) &&
       (move_constructor = copy_constructor, copy_constructor == (_func_void_ptr_void_ptr *)0x0)) {
      this = (cast_error *)__cxa_allocate_exception(0x10);
      cast_error::runtime_error
                (this,"return_value_policy = move, but the object is neither movable nor copyable!")
      ;
      goto LAB_00129719;
    }
    pvVar9 = (*move_constructor)(src);
    break;
  case reference_internal:
    *local_60.curr.vh = src;
    *(byte *)&hVar8.m_ptr[3].ob_refcnt = (byte)hVar8.m_ptr[3].ob_refcnt & 0xfe;
    keep_alive_impl(inst.super_handle.m_ptr,parent);
    goto LAB_001296ac;
  default:
    this = (cast_error *)__cxa_allocate_exception(0x10);
    cast_error::runtime_error(this,"unhandled return_value_policy: should not happen!");
LAB_00129719:
    __cxa_throw(this,&cast_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *local_60.curr.vh = pvVar9;
  bVar4 = (byte)hVar8.m_ptr[3].ob_refcnt | 1;
LAB_001296a9:
  *(byte *)&hVar8.m_ptr[3].ob_refcnt = bVar4;
LAB_001296ac:
  (*tinfo->init_instance)((instance *)hVar8.m_ptr,existing_holder);
  this_00 = (iterator *)&inst;
  hVar8 = inst.super_handle.m_ptr;
LAB_001295cb:
  this_00->inst = (instance *)0x0;
  object::~object((object *)this_00);
  return (handle)hVar8.m_ptr;
}

Assistant:

PYBIND11_NOINLINE static handle cast(const void *_src, return_value_policy policy, handle parent,
                                         const detail::type_info *tinfo,
                                         void *(*copy_constructor)(const void *),
                                         void *(*move_constructor)(const void *),
                                         const void *existing_holder = nullptr) {
        if (!tinfo) // no type info: error will be set already
            return handle();

        void *src = const_cast<void *>(_src);
        if (src == nullptr)
            return none().release();

        auto it_instances = get_internals().registered_instances.equal_range(src);
        for (auto it_i = it_instances.first; it_i != it_instances.second; ++it_i) {
            for (auto instance_type : detail::all_type_info(Py_TYPE(it_i->second))) {
                if (instance_type && same_type(*instance_type->cpptype, *tinfo->cpptype))
                    return handle((PyObject *) it_i->second).inc_ref();
            }
        }

        auto inst = reinterpret_steal<object>(make_new_instance(tinfo->type));
        auto wrapper = reinterpret_cast<instance *>(inst.ptr());
        wrapper->owned = false;
        void *&valueptr = values_and_holders(wrapper).begin()->value_ptr();

        switch (policy) {
            case return_value_policy::automatic:
            case return_value_policy::take_ownership:
                valueptr = src;
                wrapper->owned = true;
                break;

            case return_value_policy::automatic_reference:
            case return_value_policy::reference:
                valueptr = src;
                wrapper->owned = false;
                break;

            case return_value_policy::copy:
                if (copy_constructor)
                    valueptr = copy_constructor(src);
                else
                    throw cast_error("return_value_policy = copy, but the "
                                     "object is non-copyable!");
                wrapper->owned = true;
                break;

            case return_value_policy::move:
                if (move_constructor)
                    valueptr = move_constructor(src);
                else if (copy_constructor)
                    valueptr = copy_constructor(src);
                else
                    throw cast_error("return_value_policy = move, but the "
                                     "object is neither movable nor copyable!");
                wrapper->owned = true;
                break;

            case return_value_policy::reference_internal:
                valueptr = src;
                wrapper->owned = false;
                keep_alive_impl(inst, parent);
                break;

            default:
                throw cast_error("unhandled return_value_policy: should not happen!");
        }

        tinfo->init_instance(wrapper, existing_holder);

        return inst.release();
    }